

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O1

char * __thiscall cppcms::impl::string_pool::add(string_pool *this,char *s,size_t len)

{
  char *__dest;
  size_t sVar1;
  size_t __n;
  
  sVar1 = 0;
  __n = sVar1;
  if (len != 0) {
    do {
      __n = sVar1;
      if (s[sVar1] == '\0') break;
      sVar1 = sVar1 + 1;
      __n = len;
    } while (len != sVar1);
  }
  __dest = allocate_space(this,__n + 1);
  memcpy(__dest,s,__n);
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

char *add(char const *s,size_t len)
			{
				char const *tmp = s;
				size_t real_len = 0;
				while(real_len < len && *tmp!=0) {
					real_len ++;
					tmp++;
				}
				return add_bounded_string(s,real_len);
			}